

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O3

void __thiscall Dashel::UDPSocketStream::receive(UDPSocketStream *this,IPV4Address *source)

{
  _func_int *p_Var1;
  size_type __new_size;
  int *piVar2;
  socklen_t addrLen;
  sockaddr_in addr;
  uchar buf [4096];
  socklen_t local_106c;
  sockaddr local_1068;
  __type local_1058;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_1038;
  uchar local_1018 [4096];
  
  local_106c = 0x10;
  __new_size = recvfrom(*(int *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x78,
                        local_1018,0x1000,0,&local_1068,&local_106c);
  if (0 < (long)__new_size) {
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(this->super_MemoryPacketStream).super_PacketStream.field_0x20,__new_size);
    local_1038._M_cur =
         *(_Elt_pointer *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x30;
    local_1038._M_first =
         *(_Elt_pointer *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x38;
    local_1038._M_last =
         *(_Elt_pointer *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x40;
    local_1038._M_node =
         *(_Map_pointer *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x48;
    std::__copy_move_a1<false,unsigned_char*,unsigned_char>
              (&local_1058,local_1018,local_1018 + __new_size,&local_1038);
    IPV4Address::IPV4Address
              ((IPV4Address *)&local_1058,
               (uint)local_1068.sa_data._2_4_ >> 0x18 | (local_1068.sa_data._2_4_ & 0xff0000) >> 8 |
               (local_1068.sa_data._2_4_ & 0xff00) << 8 | local_1068.sa_data._2_4_ << 0x18,
               local_1068.sa_data._0_2_ << 8 | (ushort)local_1068.sa_data._0_2_ >> 8);
    source->port = local_1058._M_cur._4_2_;
    source->address = (uint)local_1058._M_cur;
    return;
  }
  p_Var1 = (this->super_MemoryPacketStream).super_PacketStream._vptr_PacketStream[-3];
  piVar2 = __errno_location();
  Stream::fail((Stream *)
               ((long)&(this->super_MemoryPacketStream).super_PacketStream._vptr_PacketStream +
               (long)p_Var1),ConnectionLost,*piVar2,"UDP Socket read I/O error.");
}

Assistant:

virtual void receive(IPV4Address& source)
		{
			unsigned char buf[4096];
			sockaddr_in addr;
			socklen_t addrLen = sizeof(addr);
			ssize_t recvCount = recvfrom(fd, buf, 4096, 0, (struct sockaddr*)&addr, &addrLen);
			if (recvCount <= 0)
				fail(DashelException::ConnectionLost, errno, "UDP Socket read I/O error.");

			receptionBuffer.resize(recvCount);
			std::copy(buf, buf + recvCount, receptionBuffer.begin());

			source = IPV4Address(ntohl(addr.sin_addr.s_addr), ntohs(addr.sin_port));
		}